

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O0

BitMatrix * __thiscall
ZXing::OneD::Code93Writer::encode(Code93Writer *this,wstring *contents_,int width,int height)

{
  int sidesMargin;
  int iVar1;
  invalid_argument *piVar2;
  long lVar3;
  BitMatrix *in_RDI;
  int check2;
  int check1;
  int indexInString;
  size_t i;
  int pos;
  vector<bool,_std::allocator<bool>_> result;
  size_t codeWidth;
  size_t length;
  string contents;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  string *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  vector<bool,_std::allocator<bool>_> *code;
  reference local_b8;
  int local_a4;
  int local_a0;
  int local_9c;
  wstring *in_stack_ffffffffffffff68;
  ulong uVar4;
  vector<bool,_std::allocator<bool>_> local_8a;
  long local_60;
  ulong local_48;
  string local_40 [64];
  
  Code93ConvertToExtended(in_stack_ffffffffffffff68);
  local_48 = std::__cxx11::string::length();
  if (local_48 == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Found empty contents");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (0x50 < local_48) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,
               "Requested contents should be less than 80 digits long after converting to extended encoding"
              );
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar3 = std::__cxx11::string::length();
  lVar3 = lVar3 * 9 + 0x25;
  local_8a.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._1_1_ = 0;
  code = &local_8a;
  local_60 = lVar3;
  std::allocator<bool>::allocator((allocator<bool> *)0x2ade3e);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
             ,(bool *)in_stack_fffffffffffffed0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::allocator<bool>::~allocator((allocator<bool> *)0x2ade6c);
  sidesMargin = AppendPattern((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (int)(in_stack_fffffffffffffed8 >> 0x20),
                              (int)in_stack_fffffffffffffed8);
  for (uVar4 = 0; uVar4 < local_48; uVar4 = uVar4 + 1) {
    std::__cxx11::string::operator[]((ulong)local_40);
    local_9c = IndexOf((char *)in_stack_fffffffffffffed0,
                       (char)((uint)in_stack_fffffffffffffecc >> 0x18));
    AppendPattern((vector<bool,_std::allocator<bool>_> *)
                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  (int)(in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8);
  }
  local_a0 = ComputeChecksumIndex(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  AppendPattern((vector<bool,_std::allocator<bool>_> *)
                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (int)(in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8);
  std::__cxx11::string::operator+=
            (local_40,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*"[local_a0]);
  local_a4 = ComputeChecksumIndex(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  AppendPattern((vector<bool,_std::allocator<bool>_> *)
                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                (int)(in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8);
  iVar1 = AppendPattern((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (int)(in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8);
  local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(iVar1,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
  std::_Bit_reference::operator=(&local_b8,true);
  WriterHelper::RenderResult(code,(int)((ulong)lVar3 >> 0x20),(int)lVar3,sidesMargin);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2ae16b)
  ;
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

BitMatrix
Code93Writer::encode(const std::wstring& contents_, int width, int height) const
{
	std::string contents = Code93ConvertToExtended(contents_);

	size_t length = contents.length();
	if (length == 0) {
		throw std::invalid_argument("Found empty contents");
	}
	if (length > 80) {
		throw std::invalid_argument("Requested contents should be less than 80 digits long after converting to extended encoding");
	}

	//length of code + 2 start/stop characters + 2 checksums, each of 9 bits, plus a termination bar
	size_t codeWidth = (contents.length() + 2 + 2) * 9 + 1;

	std::vector<bool> result(codeWidth, false);

	//start character (*)
	int pos = AppendPattern(result, 0, ASTERISK_ENCODING);

	for (size_t i = 0; i < length; i++) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[indexInString]);
	}

	//add two checksums
	int check1 = ComputeChecksumIndex(contents, 20);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check1]);

	//append the contents to reflect the first checksum added
	contents += static_cast<wchar_t>(ALPHABET[check1]);

	int check2 = ComputeChecksumIndex(contents, 15);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check2]);

	//end character (*)
	pos += AppendPattern(result, pos, ASTERISK_ENCODING);

	//termination bar (single black bar)
	result[pos] = true;

	return WriterHelper::RenderResult(result, width, height, _sidesMargin >= 0 ? _sidesMargin : 10);
}